

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

CURLMcode curl_multi_socket_all(Curl_multi *multi,int *running_handles)

{
  CURLMcode local_24;
  CURLMcode result;
  int *running_handles_local;
  Curl_multi *multi_local;
  
  if ((multi->in_callback & 1U) == 0) {
    local_24 = multi_socket(multi,true,-1,0,running_handles);
    if (local_24 < CURLM_BAD_HANDLE) {
      local_24 = Curl_update_timer(multi);
    }
    multi_local._4_4_ = local_24;
  }
  else {
    multi_local._4_4_ = CURLM_RECURSIVE_API_CALL;
  }
  return multi_local._4_4_;
}

Assistant:

CURLMcode curl_multi_socket_all(struct Curl_multi *multi, int *running_handles)
{
  CURLMcode result;
  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;
  result = multi_socket(multi, TRUE, CURL_SOCKET_BAD, 0, running_handles);
  if(CURLM_OK >= result)
    result = Curl_update_timer(multi);
  return result;
}